

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

Am_Object Class_Create(Am_String *name)

{
  ushort uVar1;
  ushort uVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  Am_String *in_RSI;
  Am_Object local_58;
  undefined1 local_4d;
  Am_String local_40;
  Am_Value_List local_38 [16];
  Am_Value_List local_28 [8];
  Am_Value_List l;
  Am_String *name_local;
  Am_Object *cls;
  
  Am_String::Am_String(&local_40,in_RSI);
  Am_Gesture_Trainer::Get_Examples((Am_String *)local_38);
  Example_Create_List(local_28);
  Am_Value_List::~Am_Value_List(local_38);
  Am_String::~Am_String(&local_40);
  local_4d = 0;
  Am_Object::Create((char *)&local_58);
  uVar2 = Am_Object::Set((ushort)&local_58,(Am_String *)(ulong)(ushort)CLASS_NAME,(ulong)in_RSI);
  uVar1 = (ushort)CLASS_EXAMPLES;
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_28);
  pAVar4 = (Am_Object *)Am_Object::Add(uVar2,(Am_Wrapper *)(ulong)uVar1,(ulong)pAVar3);
  Am_Object::Am_Object((Am_Object *)name,pAVar4);
  Am_Object::~Am_Object(&local_58);
  local_4d = 1;
  Am_Value_List::~Am_Value_List(local_28);
  return (Am_Object)(Am_Object_Data *)name;
}

Assistant:

Am_Object
Class_Create(Am_String name)
{
  Am_Value_List l = Example_Create_List(trainer.Get_Examples(name));
  Am_Object cls = Class.Create().Set(CLASS_NAME, name).Add(CLASS_EXAMPLES, l);

  return cls;
}